

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O1

pair_type __thiscall booster::locale::gnu_gettext::mo_file::value(mo_file *this,int id)

{
  uint32_t uVar1;
  uint32_t uVar2;
  runtime_error *this_00;
  pair_type pVar3;
  string local_40;
  
  uVar1 = get(this,id * 8 + this->translations_offset_);
  uVar2 = get(this,this->translations_offset_ + id * 8 + 4);
  if (((ulong)uVar2 < this->file_size_) && ((ulong)(uVar2 + uVar1) < this->file_size_)) {
    pVar3.first = this->data_ + uVar2;
    pVar3.second = pVar3.first + uVar1;
    return pVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Bad mo-file format","");
  runtime_error::runtime_error(this_00,&local_40);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

pair_type value(int id) const
                {
                    uint32_t len = get(translations_offset_ + id*8);
                    uint32_t off = get(translations_offset_ + id*8 + 4);
                    if(off >= file_size_ || off + len >= file_size_)
                        throw booster::runtime_error("Bad mo-file format");
                    return pair_type(&data_[off],&data_[off]+len);
                }